

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void rgb_ycc_start(j_compress_ptr cinfo)

{
  jpeg_color_converter *pjVar1;
  _func_void_j_compress_ptr *p_Var2;
  long local_28;
  INT32 i;
  INT32 *rgb_ycc_tab;
  my_cconvert_ptr_conflict cconvert;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->cconvert;
  p_Var2 = (_func_void_j_compress_ptr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x4000);
  pjVar1[1].start_pass = p_Var2;
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    *(long *)(p_Var2 + local_28 * 8) = local_28 * 0x4c8b;
    *(long *)(p_Var2 + local_28 * 8 + 0x800) = local_28 * 0x9646;
    *(long *)(p_Var2 + local_28 * 8 + 0x1000) = local_28 * 0x1d2f + 0x8000;
    *(long *)(p_Var2 + local_28 * 8 + 0x1800) = local_28 * -0x2b33;
    *(long *)(p_Var2 + local_28 * 8 + 0x2000) = local_28 * -0x54cd;
    *(long *)(p_Var2 + local_28 * 8 + 0x2800) = local_28 * 0x8000 + 0x807fff;
    *(long *)(p_Var2 + local_28 * 8 + 0x3000) = local_28 * -0x6b2f;
    *(long *)(p_Var2 + local_28 * 8 + 0x3800) = local_28 * -0x14d1;
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_start (j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  INT32 * rgb_ycc_tab;
  INT32 i;

  /* Allocate and fill in the conversion tables. */
  cconvert->rgb_ycc_tab = rgb_ycc_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(TABLE_SIZE * SIZEOF(INT32)));

  for (i = 0; i <= MAXJSAMPLE; i++) {
    rgb_ycc_tab[i+R_Y_OFF] = FIX(0.29900) * i;
    rgb_ycc_tab[i+G_Y_OFF] = FIX(0.58700) * i;
    rgb_ycc_tab[i+B_Y_OFF] = FIX(0.11400) * i     + ONE_HALF;
    rgb_ycc_tab[i+R_CB_OFF] = (-FIX(0.16874)) * i;
    rgb_ycc_tab[i+G_CB_OFF] = (-FIX(0.33126)) * i;
    /* We use a rounding fudge-factor of 0.5-epsilon for Cb and Cr.
     * This ensures that the maximum output will round to MAXJSAMPLE
     * not MAXJSAMPLE+1, and thus that we don't have to range-limit.
     */
    rgb_ycc_tab[i+B_CB_OFF] = FIX(0.50000) * i    + CBCR_OFFSET + ONE_HALF-1;
/*  B=>Cb and R=>Cr tables are the same
    rgb_ycc_tab[i+R_CR_OFF] = FIX(0.50000) * i    + CBCR_OFFSET + ONE_HALF-1;
*/
    rgb_ycc_tab[i+G_CR_OFF] = (-FIX(0.41869)) * i;
    rgb_ycc_tab[i+B_CR_OFF] = (-FIX(0.08131)) * i;
  }
}